

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int sign_byte_sequence(uint8_t *hash_result,EC_KEY *priv_key,uint8_t alg,
                      rtr_signature_seg *new_signature)

{
  long in_FS_OFFSET;
  int local_3c;
  rtr_bgpsec_rtvals retval;
  rtr_signature_seg *new_signature_local;
  uint8_t alg_local;
  EC_KEY *priv_key_local;
  uint8_t *hash_result_local;
  long lStack_10;
  uint sig_res;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  hash_result_local._4_4_ = 0;
  if (alg == '\x01') {
    ECDSA_sign(0,hash_result,0x20,new_signature->signature,(uint *)((long)&hash_result_local + 4),
               (EC_KEY *)priv_key);
    if (hash_result_local._4_4_ == 0) {
      local_3c = -5;
    }
    else {
      new_signature->sig_len = (uint16_t)hash_result_local._4_4_;
    }
  }
  else {
    local_3c = -6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

int sign_byte_sequence(uint8_t *hash_result, EC_KEY *priv_key, uint8_t alg, struct rtr_signature_seg *new_signature)
{
	enum rtr_bgpsec_rtvals retval = RTR_BGPSEC_SUCCESS;
	unsigned int sig_res = 0;

	if (alg == RTR_BGPSEC_ALGORITHM_SUITE_1) {
		ECDSA_sign(0, hash_result, SHA256_DIGEST_LENGTH, new_signature->signature, &sig_res, priv_key);
		if (sig_res < 1)
			retval = RTR_BGPSEC_SIGNING_ERROR;
		else
			new_signature->sig_len = sig_res;
	} else {
		retval = RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;
	}

	return retval;
}